

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

void __thiscall deqp::egl::Image::ImageTests::~ImageTests(ImageTests *this)

{
  ImageTests *this_local;
  
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageTests_0327f058;
  LabeledActions::~LabeledActions(&this->m_createActions);
  TestCaseGroup::~TestCaseGroup(&this->super_TestCaseGroup);
  return;
}

Assistant:

ImageTests						(EglTestContext& eglTestCtx, const string& name, const string& desc)
						: TestCaseGroup(eglTestCtx, name.c_str(), desc.c_str()) {}